

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavID(ImGuiID id,ImGuiNavLayer nav_layer,ImGuiID focus_scope_id,ImRect *rect_rel)

{
  ImRect *pIVar1;
  ImVec2 *in_RCX;
  ImGuiNavLayer in_ESI;
  ImGuiID in_EDI;
  ImGuiID unaff_retaddr;
  ImGuiContext *g;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->NavId = in_EDI;
  pIVar2->NavLayer = in_ESI;
  SetNavFocusScope(unaff_retaddr);
  pIVar2->NavWindow->NavLastIds[in_ESI] = in_EDI;
  pIVar1 = pIVar2->NavWindow->NavRectRel + in_ESI;
  pIVar1->Min = *in_RCX;
  pIVar1->Max = in_RCX[1];
  NavClearPreferredPosForAxis((ImGuiAxis)((ulong)pIVar2 >> 0x20));
  NavClearPreferredPosForAxis((ImGuiAxis)((ulong)pIVar2 >> 0x20));
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, ImGuiNavLayer nav_layer, ImGuiID focus_scope_id, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);
    IM_ASSERT(nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu);
    g.NavId = id;
    g.NavLayer = nav_layer;
    SetNavFocusScope(focus_scope_id);
    g.NavWindow->NavLastIds[nav_layer] = id;
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;

    // Clear preferred scoring position (NavMoveRequestApplyResult() will tend to restore it)
    NavClearPreferredPosForAxis(ImGuiAxis_X);
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
}